

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O1

char * get_savestate_path(char *romfile,int number)

{
  long lVar1;
  gbamem_t *pgVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char **ppcVar7;
  _Bool enable_graphics;
  char *filename;
  long lVar8;
  char buf [4096];
  char acStack_1018 [4096];
  
  filename = acStack_1018;
  pcVar4 = realpath(romfile,acStack_1018);
  sVar5 = strlen(pcVar4);
  iVar3 = (int)sVar5 + 9;
  if (iVar3 < 0x1000) {
    pcVar4 = (char *)malloc((long)iVar3);
    snprintf(pcVar4,(long)iVar3,"%s.%02d.save",acStack_1018,number);
    return pcVar4;
  }
  get_savestate_path_cold_1();
  mem = init_mem();
  load_gbarom(pcVar4);
  pcVar6 = get_backup_path(pcVar4);
  pgVar2 = mem;
  mem->backup_path = pcVar6;
  ppcVar7 = (char **)malloc(0x50);
  pgVar2->savestate_path = ppcVar7;
  lVar8 = 0;
  do {
    lVar1 = lVar8 + 1;
    pcVar6 = get_savestate_path(pcVar4,(int)lVar1);
    mem->savestate_path[lVar8] = pcVar6;
    lVar8 = lVar1;
  } while (lVar1 != 10);
  if (filename != (char *)0x0) {
    load_alternate_bios(filename);
  }
  cpu = init_arm7tdmi(gba_read_byte,gba_read_half,gba_read_word,gba_write_byte,gba_write_half,
                      gba_write_word);
  fill_pipe(cpu);
  ppu = init_ppu(enable_graphics);
  bus = init_gbabus();
  apu = init_apu(enable_graphics);
  return (char *)apu;
}

Assistant:

const char* get_savestate_path(const char* romfile, int number) {
    char buf[PATH_MAX];
    char* rom_path = portable_realpath(romfile, buf);
    int savestate_path_buf_size = strlen(rom_path) + 9; // .xx.save + null terminator

    if (savestate_path_buf_size >= PATH_MAX) {
        logfatal("Savestate path too long! How deeply are you nesting your directories?")
    }

    char* savestate_path = malloc(savestate_path_buf_size);
    snprintf(savestate_path, savestate_path_buf_size, "%s.%02d.save", buf, number);
    return savestate_path;
}